

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

ParameterError parse_output(OperationConfig *config,char *nextarg)

{
  bool bVar1;
  getout *local_30;
  getout *url;
  ParameterError err;
  char *nextarg_local;
  OperationConfig *config_local;
  
  if (config->url_out == (getout *)0x0) {
    config->url_out = config->url_list;
  }
  if (config->url_out != (getout *)0x0) {
    while( true ) {
      bVar1 = false;
      if (config->url_out != (getout *)0x0) {
        bVar1 = (config->url_out->flags & 1U) != 0;
      }
      if (!bVar1) break;
      config->url_out = config->url_out->next;
    }
  }
  if (config->url_out == (getout *)0x0) {
    local_30 = new_getout(config);
    config->url_out = local_30;
  }
  else {
    local_30 = config->url_out;
  }
  if (local_30 == (getout *)0x0) {
    config_local._4_4_ = PARAM_NO_MEM;
  }
  else {
    config_local._4_4_ = getstr(&local_30->outfile,nextarg,false);
    local_30->flags = local_30->flags & 0xfffffffb;
    local_30->flags = local_30->flags | 1;
  }
  return config_local._4_4_;
}

Assistant:

static ParameterError parse_output(struct OperationConfig *config,
                                   const char *nextarg)
{
  ParameterError err = PARAM_OK;
  struct getout *url;

  /* output file */
  if(!config->url_out)
    config->url_out = config->url_list;
  if(config->url_out) {
    /* there is a node here, if it already is filled-in continue to find
       an "empty" node */
    while(config->url_out && (config->url_out->flags & GETOUT_OUTFILE))
      config->url_out = config->url_out->next;
  }

  /* now there might or might not be an available node to fill in! */

  if(config->url_out)
    /* existing node */
    url = config->url_out;
  else {
    /* there was no free node, create one! */
    config->url_out = url = new_getout(config);
  }

  if(!url)
    return PARAM_NO_MEM;

  /* fill in the outfile */
  err = getstr(&url->outfile, nextarg, DENY_BLANK);
  url->flags &= ~GETOUT_USEREMOTE; /* switch off */
  url->flags |= GETOUT_OUTFILE;
  return err;
}